

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

void RtMidi_init(RtMidi *midi,lua_State *L,int index)

{
  mapped_type *pmVar1;
  RtMidi *local_38;
  pair<RtMidi_*,_lua_State_*> local_30;
  int local_1c;
  lua_State *plStack_18;
  int index_local;
  lua_State *L_local;
  RtMidi *midi_local;
  
  local_1c = index;
  plStack_18 = L;
  L_local = (lua_State *)midi;
  (*midi->_vptr_RtMidi[6])(midi,anon_unknown.dwarf_7314::RtMidiDefaultErrorCallback,L);
  local_38 = (RtMidi *)L_local;
  std::pair<RtMidi_*,_lua_State_*>::pair<RtMidi_*,_lua_State_*&,_true>
            (&local_30,&local_38,&stack0xffffffffffffffe8);
  pmVar1 = std::
           map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
           ::operator[]((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                         *)(anonymous_namespace)::RtMidi_callbacks,&local_30);
  *pmVar1 = -2;
  return;
}

Assistant:

LUA_RTMIDI_LOCAL void RtMidi_init(RtMidi &midi, lua_State *L, int index) {
	midi.setErrorCallback(RtMidiDefaultErrorCallback, L);
	RtMidi_callbacks[{&midi, L}] = LUA_NOREF;

//	lua_pushlightuserdata(L, &REGISTRY_CALLBACK_ENABLED);
//	lua_rawget(L, LUA_REGISTRYINDEX);
//	lua_pushvalue(L, index);
//	lua_pushnil(L);
//	lua_rawset(L, -3);
//	lua_pop(L, 1);
}